

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PedestriansWalkingAnEight.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_9ea68::Pedestrian::reset(Pedestrian *this)

{
  long *plVar1;
  int iVar2;
  PolylineSegmentedPathwaySingleRadius *pPVar3;
  float extraout_XMM0_Da;
  float fVar4;
  float fVar5;
  Vec3 VVar6;
  float local_38;
  
  OpenSteer::SimpleVehicle::reset((SimpleVehicle *)this);
  (**(code **)(*(long *)this + 0x108))(0x40000000,this);
  (**(code **)(*(long *)this + 0xf8))(0x41000000,this);
  (**(code **)(*(long *)this + 0xe0))(0,this);
  (**(code **)(*(long *)this + 200))(0x3f000000,this);
  pPVar3 = getTestPath();
  *(PolylineSegmentedPathwaySingleRadius **)(this + 0xf0) = pPVar3;
  (*(pPVar3->super_SegmentedPathway).super_Pathway._vptr_Pathway[7])(pPVar3);
  iVar2 = rand();
  fVar4 = OpenSteer::PolylineSegmentedPathwaySingleRadius::radius
                    (*(PolylineSegmentedPathwaySingleRadius **)(this + 0xf0));
  VVar6 = OpenSteer::randomVectorOnUnitRadiusXZDisk();
  fVar5 = (float)(**(code **)(**(long **)(this + 0xf0) + 0x20))
                           ((float)iVar2 * 4.656613e-10 * extraout_XMM0_Da);
  local_38 = VVar6.x;
  (**(code **)(*(long *)this + 0x48))(fVar5 + fVar4 * local_38,this);
  OpenSteer::SimpleVehicle::randomizeHeadingOnXZPlane((SimpleVehicle *)this);
  iVar2 = rand();
  *(uint *)(this + 0xf8) = (uint)((float)iVar2 * 4.656613e-10 <= 0.5) * 2 + -1;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  setTrailParameters((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                     this,3.0,0x3c);
  plVar1 = *(long **)(this + 0xe8);
  (**(code **)(*(long *)this + 0x40))(this);
  (**(code **)(*plVar1 + 0x10))(plVar1);
  return;
}

Assistant:

void reset (void)
        {
            // reset the vehicle 
            SimpleVehicle::reset ();
            
            // max speed and max steering force (maneuverability) 
            setMaxSpeed (2.0);
            setMaxForce (8.0);
            
            // initially stopped
            setSpeed (0);
            
            // size of bounding sphere, for obstacle avoidance, etc.
            setRadius (0.5); // width = 0.7, add 0.3 margin, take half
            
            // set the path for this Pedestrian to follow
            path = getTestPath ();
            
            // set initial position
            // (random point on path + random horizontal offset)
            const float d = path->length() * frandom01();
            const float r = path->radius();
            const Vec3 randomOffset = randomVectorOnUnitRadiusXZDisk () * r;
            setPosition (path->mapPathDistanceToPoint (d) + randomOffset);
            
            // randomize 2D heading
            randomizeHeadingOnXZPlane ();
            
            // pick a random direction for path following (upstream or downstream)
            pathDirection = (frandom01() > 0.5) ? -1 : +1;
            
            // trail parameters: 3 seconds with 60 points along the trail
            setTrailParameters (3, 60);
            
            // notify proximity database that our position has changed
            proximityToken->updateForNewPosition (position());
        }